

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void maxmin(int *a,int n,int *max,int *min)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int min1;
  int min2;
  int max2;
  int max1;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (n == 2) {
    iVar4 = *a;
    iVar1 = a[1];
    iVar3 = iVar1;
    if (iVar1 < iVar4) {
      iVar3 = iVar4;
    }
    *max = iVar3;
    piVar2 = a + 1;
    if (iVar4 <= iVar1) {
      piVar2 = a;
    }
    local_3c = *piVar2;
  }
  else if (n == 1) {
    local_3c = *a;
    *max = local_3c;
  }
  else {
    iVar4 = n / 2;
    maxmin(a,iVar4,&local_34,&local_40);
    maxmin(a + iVar4,n - iVar4,&local_38,&local_3c);
    if (local_38 < local_34) {
      local_38 = local_34;
    }
    *max = local_38;
    if (local_40 < local_3c) {
      local_3c = local_40;
    }
  }
  *min = local_3c;
  return;
}

Assistant:

void maxmin(int *a,int n,int *max,int *min)
{
    int max1,min1,max2,min2;
    switch(n)
    {
        case 1: *max=a[0];
            *min=a[0];
            return;
        case 2: if(a[0]>a[1])
            {
                *max=a[0];
                *min=a[1];
            }
            else
            {
                *max=a[1];
                *min=a[0];
            }
            return;
        default:maxmin(a,n/2,&max1,&min1);
            maxmin(a+n/2,n-n/2,&max2,&min2);
            *max=(max1>max2?max1:max2);
            *min=(min1<min2?min1:min2);
            return;
    }
}